

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

void __thiscall AixLog::Log::sync(Log *this)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  stringstream *psVar5;
  undefined8 uVar6;
  shared_ptr<AixLog::Sink> *sink;
  pointer psVar7;
  pthread_mutex_t *__mutex;
  long *local_58;
  long local_50;
  long local_48 [2];
  pthread_mutex_t *local_38;
  
  __mutex = (pthread_mutex_t *)&this->mutex_;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    get_stream_abi_cxx11_(this);
    std::__cxx11::stringbuf::str();
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (local_50 != 0) {
      local_38 = __mutex;
      if ((this->conditional_).is_true_ == true) {
        psVar7 = (this->log_sinks_).
                 super__Vector_base<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (this->log_sinks_).
                 super__Vector_base<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar7 != psVar1) {
          do {
            bVar3 = Filter::match(&((psVar7->
                                    super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->filter,&this->metadata_);
            if (bVar3) {
              peVar2 = (psVar7->super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              ;
              get_stream_abi_cxx11_(this);
              std::__cxx11::stringbuf::str();
              (*peVar2->_vptr_Sink[2])(peVar2,&this->metadata_,&local_58);
              if (local_58 != local_48) {
                operator_delete(local_58,local_48[0] + 1);
              }
            }
            psVar7 = psVar7 + 1;
          } while (psVar7 != psVar1);
        }
      }
      __mutex = local_38;
      psVar5 = get_stream_abi_cxx11_(this);
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      std::__cxx11::stringbuf::str((string *)(psVar5 + 0x18));
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      psVar5 = get_stream_abi_cxx11_(this);
      std::ios::clear((int)psVar5 + (int)*(undefined8 *)(*(long *)psVar5 + -0x18));
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar4);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pthread_mutex_unlock(local_38);
  _Unwind_Resume(uVar6);
}

Assistant:

int sync() override {
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if (!get_stream().str().empty()) {
      if (conditional_.is_true()) {
        for (const auto& sink : log_sinks_) {
          if (sink->filter.match(metadata_))
            sink->log(metadata_, get_stream().str());
        }
      }
      get_stream().str("");
      get_stream().clear();
    }

    return 0;
  }